

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrixUtil.hpp
# Opt level: O0

Matrix<float,_3,_2> * __thiscall
tcu::transpose<float,2,3>
          (Matrix<float,_3,_2> *__return_storage_ptr__,tcu *this,Matrix<float,_2,_3> *mat)

{
  float fVar1;
  float *pfVar2;
  undefined4 local_24;
  undefined4 local_20;
  int col;
  int row;
  Matrix<float,_2,_3> *mat_local;
  Matrix<float,_3,_2> *res;
  
  Matrix<float,_3,_2>::Matrix(__return_storage_ptr__);
  for (local_20 = 0; local_20 < 2; local_20 = local_20 + 1) {
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      pfVar2 = Matrix<float,_2,_3>::operator()((Matrix<float,_2,_3> *)this,local_20,local_24);
      fVar1 = *pfVar2;
      pfVar2 = Matrix<float,_3,_2>::operator()(__return_storage_ptr__,local_24,local_20);
      *pfVar2 = fVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix<T, Cols, Rows> transpose (const Matrix<T, Rows, Cols>& mat)
{
	Matrix<T, Cols, Rows> res;
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			res(col, row) = mat(row, col);
	return res;
}